

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QAbstractButton_*>::end(QList<QAbstractButton_*> *this)

{
  QAbstractButton **n;
  QArrayDataPointer<QAbstractButton_*> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QAbstractButton_*> *)0x5035a9);
  QArrayDataPointer<QAbstractButton_*>::operator->(in_RDI);
  n = QArrayDataPointer<QAbstractButton_*>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }